

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O3

int __thiscall
ncnn::ConvolutionDepthWise::forward
          (ConvolutionDepthWise *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  void *pvVar2;
  int *piVar3;
  int iVar4;
  pointer piVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  void *pvVar13;
  uint uVar14;
  ulong uVar15;
  void *pvVar16;
  ulong uVar17;
  uint _w;
  ulong uVar18;
  long lVar19;
  int iVar20;
  int iVar21;
  void *pvVar22;
  ulong uVar23;
  void *pvVar24;
  float *pfVar25;
  int iVar26;
  float fVar27;
  vector<int,_std::allocator<int>_> _space_ofs;
  void *local_180;
  allocator_type local_171;
  size_t local_170;
  ulong local_168;
  ulong local_160;
  void *local_158;
  ulong local_150;
  void *local_148;
  void *local_140;
  ulong local_138;
  ConvolutionDepthWise *local_130;
  float *local_128;
  float *local_120;
  ulong local_118;
  ulong local_110;
  long local_108;
  void *local_100;
  long local_f8;
  ulong local_f0;
  ulong local_e8;
  ulong local_e0;
  ulong local_d8;
  void *local_d0;
  void *local_c8;
  ulong local_c0;
  int local_b4;
  void *local_b0;
  Mat local_a8;
  long local_60;
  void *local_58;
  ulong local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  if ((opt->use_int8_inference == true) && ((this->weight_data).elemsize == 1)) {
    iVar6 = forward_int8(this,bottom_blob,top_blob,opt);
    return iVar6;
  }
  uVar14 = bottom_blob->c;
  iVar6 = -100;
  if (((int)uVar14 % this->group == 0) && (this->num_output % this->group == 0)) {
    pvVar16 = (void *)bottom_blob->elemsize;
    iVar26 = this->kernel_w;
    iVar20 = this->kernel_h;
    iVar8 = this->dilation_w;
    iVar9 = this->dilation_h;
    local_a8.elemsize._0_4_ = 0;
    local_a8.elemsize._4_4_ = 0;
    local_a8.elempack = 0;
    local_a8.data = (void *)0x0;
    local_a8.refcount._0_4_ = 0;
    local_a8.refcount._4_4_ = 0;
    local_a8.allocator = (Allocator *)0x0;
    local_a8.dims = 0;
    local_a8.w = 0;
    local_a8.h = 0;
    local_a8.c = 0;
    local_a8.cstep = 0;
    make_padding(this,bottom_blob,&local_a8,opt);
    iVar6 = -100;
    if ((local_a8.data != (void *)0x0) && ((long)local_a8.c * local_a8.cstep != 0)) {
      iVar4 = local_a8.w;
      uVar18 = (long)(~((iVar26 + -1) * iVar8) + local_a8.w) / (long)this->stride_w;
      uVar12 = uVar18 & 0xffffffff;
      uVar15 = (long)(~((iVar20 + -1) * iVar9) + local_a8.h) / (long)this->stride_h;
      uVar7 = this->kernel_w * this->kernel_h;
      local_158 = (void *)(long)(int)uVar7;
      local_168 = (ulong)uVar14;
      local_140 = pvVar16;
      std::vector<int,_std::allocator<int>_>::vector(&local_48,(size_type)local_158,&local_171);
      piVar5 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      _w = (int)uVar18 + 1;
      uVar14 = (int)uVar15 + 1;
      iVar6 = this->kernel_h;
      if (0 < iVar6) {
        iVar26 = this->dilation_h;
        iVar20 = this->kernel_w;
        iVar8 = this->dilation_w * iVar20;
        iVar9 = 0;
        iVar11 = 0;
        iVar21 = 0;
        do {
          if (0 < iVar20) {
            lVar19 = 0;
            do {
              local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[iVar9 + lVar19] = iVar11;
              iVar11 = iVar11 + this->dilation_w;
              iVar20 = this->kernel_w;
              lVar19 = lVar19 + 1;
            } while ((int)lVar19 < iVar20);
            iVar9 = iVar9 + (int)lVar19;
            iVar6 = this->kernel_h;
          }
          iVar11 = iVar11 + (iVar4 * iVar26 - iVar8);
          iVar21 = iVar21 + 1;
        } while (iVar21 < iVar6);
      }
      local_f0 = uVar15 & 0xffffffff;
      Mat::create(top_blob,_w,uVar14,this->num_output,(size_t)local_140,opt->blob_allocator);
      local_b0 = top_blob->data;
      iVar6 = -100;
      if ((local_b0 != (void *)0x0) &&
         (local_170 = top_blob->cstep, (long)top_blob->c * local_170 != 0)) {
        uVar1 = this->group;
        uVar10 = (uint)local_168;
        local_130 = this;
        if (uVar1 == this->num_output && uVar10 == uVar1) {
          if (0 < (int)uVar10) {
            local_170 = local_170 * top_blob->elemsize;
            pvVar16 = (this->weight_data).data;
            local_138 = CONCAT44(local_138._4_4_,local_a8.w);
            local_100 = local_a8.data;
            local_f8 = CONCAT44(local_a8.elemsize._4_4_,(undefined4)local_a8.elemsize);
            local_108 = local_a8.cstep * local_f8;
            local_128 = (float *)(long)(int)_w;
            local_e0 = (ulong)uVar14;
            pvVar13 = (void *)(ulong)_w;
            lVar19 = (long)local_158 * 4;
            uVar18 = 0;
            local_148 = pvVar13;
            local_e8 = uVar12;
            do {
              if (-1 < (int)local_f0) {
                local_158 = (void *)(local_108 * uVar18 + (long)local_100);
                pvVar22 = (void *)(local_170 * uVar18 + (long)local_b0);
                iVar6 = local_130->bias_term;
                local_160 = CONCAT44(local_160._4_4_,local_130->stride_h * (int)local_138);
                local_c0 = (ulong)local_130->stride_w;
                uVar15 = (ulong)(local_130->activation_type - 1);
                local_150 = 0;
                local_d0 = (void *)CONCAT44(local_d0._4_4_,iVar6);
                local_d8 = uVar15;
                do {
                  if (-1 < (int)local_e8) {
                    local_120 = (float *)(local_130->activation_params).data;
                    pvVar2 = (local_130->bias_data).data;
                    local_140 = (void *)(((int)local_160 * (int)local_150) * local_f8 +
                                        (long)local_158);
                    pvVar24 = (void *)0x0;
                    local_c8 = pvVar22;
                    do {
                      if (iVar6 == 0) {
                        fVar27 = 0.0;
                      }
                      else {
                        fVar27 = *(float *)((long)pvVar2 + uVar18 * 4);
                      }
                      if (0 < (int)uVar7) {
                        uVar12 = 0;
                        do {
                          fVar27 = fVar27 + *(float *)((long)pvVar16 + uVar12 * 4) *
                                            *(float *)((long)local_140 +
                                                      (long)piVar5[uVar12] * 4 +
                                                      (long)pvVar24 * local_c0 * 4);
                          uVar12 = uVar12 + 1;
                        } while (uVar7 != uVar12);
                      }
                      if ((uint)uVar15 < 4) {
                        switch((long)&switchD_0015181d::switchdataD_0016e460 +
                               (long)(int)(&switchD_0015181d::switchdataD_0016e460)[uVar15]) {
                        case 0x15181f:
                          if (fVar27 <= 0.0) {
                            fVar27 = 0.0;
                          }
                          break;
                        case 0x15182c:
                          if (fVar27 <= *local_120) {
                            fVar27 = *local_120;
                          }
                          if (local_120[1] < fVar27) {
                            fVar27 = local_120[1];
                          }
                          break;
                        case 0x151848:
                          fVar27 = expf(-fVar27);
                          pvVar13 = local_148;
                          pvVar22 = local_c8;
                          uVar15 = local_d8;
                          fVar27 = 1.0 / (fVar27 + 1.0);
                          iVar6 = (int)local_d0;
                          break;
                        case 0x15189e:
                          fVar27 = fVar27 * (float)(~-(uint)(0.0 < fVar27) & (uint)*local_120 |
                                                   -(uint)(0.0 < fVar27) & 0x3f800000);
                        }
                      }
                      *(float *)((long)pvVar22 + (long)pvVar24 * 4) = fVar27;
                      pvVar24 = (void *)((long)pvVar24 + 1);
                    } while (pvVar24 != pvVar13);
                  }
                  pvVar22 = (void *)((long)pvVar22 + (long)local_128 * 4);
                  local_150 = local_150 + 1;
                } while (local_150 != local_e0);
              }
              uVar18 = uVar18 + 1;
              pvVar16 = (void *)((long)pvVar16 + lVar19);
            } while (uVar18 != local_168);
          }
        }
        else {
          uVar18 = (long)((ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 | local_168 & 0xffffffff) /
                   (long)(int)uVar1;
          if (0 < (int)uVar1) {
            uVar23 = uVar18 & 0xffffffff;
            uVar15 = (long)this->num_output / (long)(int)uVar1;
            local_138 = uVar15 & 0xffffffff;
            local_170 = local_170 * top_blob->elemsize;
            local_58 = (this->weight_data).data;
            iVar6 = (int)uVar18 * (int)local_158;
            local_f8 = (long)(int)_w;
            local_b4 = (int)uVar15;
            local_60 = (long)local_b4;
            local_120 = (float *)(ulong)_w;
            uVar17 = (ulong)local_158 & 0xffffffff;
            local_b4 = local_b4 * iVar6;
            local_100 = (void *)((long)iVar6 << 2);
            pvVar16 = (void *)((long)local_158 << 2);
            local_110 = 0;
            local_118 = 0;
            local_e0 = CONCAT44(local_e0._4_4_,(int)uVar18);
            uVar15 = local_f0;
            local_158 = pvVar16;
            local_e8 = uVar12;
            local_50 = (ulong)uVar1;
            do {
              if (0 < (int)local_138) {
                local_148 = (void *)((long)local_58 + (long)(int)local_110 * 4);
                local_108 = local_118 * local_60;
                iVar26 = (int)uVar23;
                iVar6 = (int)local_118;
                local_168 = 0;
                do {
                  if (-1 < (int)uVar15) {
                    local_150 = local_168 + local_108;
                    local_180 = (void *)(local_170 * local_150 + (long)local_b0);
                    local_140 = (void *)CONCAT44(local_140._4_4_,local_130->bias_term);
                    local_160 = 0;
                    local_c0 = (ulong)(local_130->activation_type - 1);
                    do {
                      if (-1 < (int)uVar12) {
                        local_128 = (float *)(local_130->activation_params).data;
                        local_c8 = (local_130->bias_data).data;
                        lVar19 = local_a8.cstep *
                                 CONCAT44(local_a8.elemsize._4_4_,(undefined4)local_a8.elemsize);
                        local_d0 = (void *)((long)(local_a8.w * (int)local_160 * local_130->stride_h
                                                  ) * CONCAT44(local_a8.elemsize._4_4_,
                                                               (undefined4)local_a8.elemsize) +
                                           (long)local_a8.data);
                        local_d8 = (ulong)local_130->stride_w;
                        pfVar25 = (float *)0x0;
                        do {
                          if ((int)local_140 == 0) {
                            fVar27 = 0.0;
                          }
                          else {
                            fVar27 = *(float *)((long)local_c8 + local_150 * 4);
                          }
                          if (0 < (int)uVar23) {
                            uVar15 = 0;
                            pvVar13 = local_148;
                            do {
                              if (0 < (int)uVar7) {
                                uVar12 = 0;
                                do {
                                  fVar27 = fVar27 + *(float *)((long)pvVar13 + uVar12 * 4) *
                                                    *(float *)((long)local_d0 +
                                                              (long)piVar5[uVar12] * 4 +
                                                              (uVar15 + (uint)(iVar26 * iVar6)) *
                                                              lVar19 + (long)pfVar25 * local_d8 * 4)
                                  ;
                                  uVar12 = uVar12 + 1;
                                } while (uVar17 != uVar12);
                              }
                              uVar15 = uVar15 + 1;
                              pvVar13 = (void *)((long)pvVar13 + (long)pvVar16);
                            } while (uVar15 != (uVar18 & 0xffffffff));
                          }
                          if ((uint)local_c0 < 4) {
                            switch((long)&switchD_00151b87::switchdataD_0016e450 +
                                   (long)(int)(&switchD_00151b87::switchdataD_0016e450)[local_c0]) {
                            case 0x151b89:
                              if (fVar27 <= 0.0) {
                                fVar27 = 0.0;
                              }
                              break;
                            case 0x151b93:
                              if (fVar27 <= *local_128) {
                                fVar27 = *local_128;
                              }
                              if (local_128[1] < fVar27) {
                                fVar27 = local_128[1];
                              }
                              break;
                            case 0x151bab:
                              fVar27 = expf(-fVar27);
                              uVar23 = local_e0 & 0xffffffff;
                              pvVar16 = local_158;
                              fVar27 = 1.0 / (fVar27 + 1.0);
                              break;
                            case 0x151bde:
                              fVar27 = fVar27 * (float)(~-(uint)(0.0 < fVar27) & (uint)*local_128 |
                                                       -(uint)(0.0 < fVar27) & 0x3f800000);
                            }
                          }
                          *(float *)((long)local_180 + (long)pfVar25 * 4) = fVar27;
                          pfVar25 = (float *)((long)pfVar25 + 1);
                        } while (pfVar25 != local_120);
                      }
                      local_180 = (void *)((long)local_180 + local_f8 * 4);
                      iVar20 = (int)local_160;
                      local_160 = (ulong)(iVar20 + 1);
                      uVar15 = local_f0;
                      uVar12 = local_e8;
                    } while (iVar20 != (int)local_f0);
                  }
                  local_168 = local_168 + 1;
                  local_148 = (void *)((long)local_148 + (long)local_100);
                } while (local_168 != local_138);
              }
              local_118 = local_118 + 1;
              local_110 = (ulong)(uint)((int)local_110 + local_b4);
            } while (local_118 != local_50);
          }
        }
        iVar6 = 0;
      }
      if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
    piVar3 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (local_a8.allocator == (Allocator *)0x0) {
          if (local_a8.data != (void *)0x0) {
            free(local_a8.data);
          }
        }
        else {
          (**(code **)(*(long *)local_a8.allocator + 0x18))();
        }
      }
    }
  }
  return iVar6;
}

Assistant:

int ConvolutionDepthWise::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return forward_int8(bottom_blob, top_blob, opt);
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    if (channels % group != 0 || num_output % group != 0)
    {
        // reject invalid group
        return -100;
    }

//     fprintf(stderr, "ConvolutionDepthWise input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d\n", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // float32
    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // depth-wise
    if (channels == group && group == num_output)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g=0; g<group; g++)
        {
            float* outptr = top_blob.channel(g);
            const float* kptr = (const float*)weight_data + maxk * g;
            const Mat m = bottom_blob_bordered.channel(g);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                        sum = bias_data[g];

                    const float* sptr = m.row(i*stride_h) + j*stride_w;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[ space_ofs[k] ];
                        float w = kptr[k];
                        sum += val * w;
                    }

                    if (activation_type == 1)
                    {
                        sum = std::max(sum, 0.f);
                    }
                    else if (activation_type == 2)
                    {
                        float slope = activation_params[0];
                        sum = sum > 0.f ? sum : sum * slope;
                    }
                    else if (activation_type == 3)
                    {
                        float min = activation_params[0];
                        float max = activation_params[1];
                        if (sum < min)
                            sum = min;
                        if (sum > max)
                            sum = max;
                    }
                    else if (activation_type == 4)
                    {
                        sum = static_cast<float>(1.f / (1.f + exp(-sum)));
                    }

                    outptr[j] = sum;
                }

                outptr += outw;
            }
        }
    }
    else
    {
        // group convolution
        const int channels_g = channels / group;
        const int num_output_g = num_output / group;

#ifdef _WIN32
        #pragma omp parallel for num_threads(opt.num_threads)
#else // _WIN32
        #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif // _WIN32
        for (int g=0; g<group; g++)
        {
            for (int p=0; p<num_output_g; p++)
            {
                float* outptr = top_blob.channel(g * num_output_g + p);
                const float* weight_data_ptr = (const float*)weight_data + maxk * channels_g * num_output_g * g;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                            sum = bias_data[num_output_g * g + p];

                        const float* kptr = weight_data_ptr + maxk * channels_g * p;

                        // channels_g
                        for (int q=0; q<channels_g; q++)
                        {
                            const Mat m = bottom_blob_bordered.channel(channels_g * g + q);
                            const float* sptr = m.row(i*stride_h) + j*stride_w;

                            for (int k = 0; k < maxk; k++)
                            {
                                float val = sptr[ space_ofs[k] ];
                                float w = kptr[k];
                                sum += val * w;
                            }

                            kptr += maxk;
                        }

                        if (activation_type == 1)
                        {
                            sum = std::max(sum, 0.f);
                        }
                        else if (activation_type == 2)
                        {
                            float slope = activation_params[0];
                            sum = sum > 0.f ? sum : sum * slope;
                        }
                        else if (activation_type == 3)
                        {
                            float min = activation_params[0];
                            float max = activation_params[1];
                            if (sum < min)
                                sum = min;
                            if (sum > max)
                                sum = max;
                        }
                        else if (activation_type == 4)
                        {
                            sum = static_cast<float>(1.f / (1.f + exp(-sum)));
                        }

                        outptr[j] = sum;
                    }

                    outptr += outw;
                }
            }
        }
    }

    return 0;
}